

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pandore
          (CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  uchar *puVar7;
  float *ptr;
  uint *puVar8;
  CImgArgumentException *this_00;
  CImgIOException *pCVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  uint dims [8];
  uint imageid;
  int ptbuf [4];
  CImg<char> header;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar12 = "non-";
    if (this->_is_shared != false) {
      pcVar12 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar12,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  CImg<char>::CImg(&header,0x20,1,1,1);
  cimg::fread<char>(header._data,0xc,(FILE *)__stream);
  iVar5 = cimg::strncasecmp("PANDORE",header._data,7);
  if (iVar5 != 0) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar12 = "non-";
    if (this->_is_shared != false) {
      pcVar12 = "";
    }
    pcVar13 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar13 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar9,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): PANDORE header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar12,"unsigned char",pcVar13);
    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  dims[4] = 0;
  dims[5] = 0;
  dims[6] = 0;
  dims[7] = 0;
  dims[0] = 0;
  dims[1] = 0;
  dims[2] = 0;
  dims[3] = 0;
  ptbuf[0] = 0;
  ptbuf[1] = 0;
  ptbuf[2] = 0;
  ptbuf[3] = 0;
  cimg::fread<unsigned_int>(&imageid,1,(FILE *)__stream);
  uVar1 = imageid;
  if (0xff < imageid) {
    cimg::invert_endianness<unsigned_int>(&imageid);
  }
  cimg::fread<char>(header._data,0x14,(FILE *)__stream);
  switch(imageid) {
  case 2:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,1);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 3:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 4:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 5:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 6:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 7:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 8:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 9:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 10:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0xb:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[1],1,1,1);
    uVar6 = this->_spectrum * this->_depth * this->_height * this->_width;
    if (dims[2] < 0x100) {
      uVar16 = (ulong)uVar6;
      puVar7 = (uchar *)operator_new__(uVar16);
      cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = puVar7[lVar10];
      }
      goto LAB_001aa311;
    }
    uVar16 = (ulong)uVar6;
    if (dims[2] < 0x10000) {
      uVar15 = uVar16 * 2;
      puVar8 = (uint *)operator_new__(uVar15);
      cimg::fread<unsigned_short>((unsigned_short *)puVar8,uVar16,(FILE *)__stream);
      if (0xff < uVar1) {
        cimg::invert_endianness<unsigned_short>((unsigned_short *)puVar8,uVar16);
      }
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = (uchar)*(unsigned_short *)((long)puVar8 + lVar10 * 2);
        uVar15 = uVar15 - 2;
      }
    }
    else {
      uVar15 = uVar16 * 4;
      puVar8 = (uint *)operator_new__(uVar15);
      cimg::fread<unsigned_int>(puVar8,uVar16,(FILE *)__stream);
      if (0xff < uVar1) {
        cimg::invert_endianness<unsigned_int>(puVar8,uVar16);
      }
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = (uchar)puVar8[lVar10];
        uVar15 = uVar15 - 4;
      }
    }
    puVar7 = (uchar *)((long)puVar8 - uVar15);
    goto LAB_001aa317;
  case 0xc:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (dims[3] < 0x100) {
      puVar7 = (uchar *)operator_new__(uVar16);
      cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = puVar7[lVar10];
      }
      goto LAB_001aa311;
    }
    if (dims[3] < 0x10000) {
      uVar15 = uVar16 * 2;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (long)uVar16) {
        uVar11 = uVar15;
      }
      puVar8 = (uint *)operator_new__(uVar11);
      cimg::fread<unsigned_short>((unsigned_short *)puVar8,uVar16,(FILE *)__stream);
      if (0xff < uVar1) {
        cimg::invert_endianness<unsigned_short>((unsigned_short *)puVar8,uVar16);
      }
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = (uchar)*(unsigned_short *)((long)puVar8 + lVar10 * 2);
        uVar15 = uVar15 - 2;
      }
    }
    else {
      uVar15 = uVar16 * 4;
      puVar8 = (uint *)operator_new__(-(ulong)(uVar16 >> 0x3e != 0) | uVar15);
      cimg::fread<unsigned_int>(puVar8,uVar16,(FILE *)__stream);
      if (0xff < uVar1) {
        cimg::invert_endianness<unsigned_int>(puVar8,uVar16);
      }
      puVar4 = this->_data;
      uVar1 = this->_width;
      uVar6 = this->_height;
      uVar2 = this->_depth;
      uVar3 = this->_spectrum;
      for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
          lVar10 = lVar10 + 1) {
        puVar4[lVar10] = (uchar)puVar8[lVar10];
        uVar15 = uVar15 - 4;
      }
    }
LAB_001aa7e7:
    pvVar14 = (void *)((long)puVar8 - uVar15);
    goto LAB_001aa4d1;
  case 0xd:
    cimg::fread<unsigned_int>(dims,5,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,5);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0xff < dims[4]) {
      if (dims[4] < 0x10000) {
        uVar15 = uVar16 * 2;
        uVar11 = 0xffffffffffffffff;
        if (-1 < (long)uVar16) {
          uVar11 = uVar15;
        }
        puVar8 = (uint *)operator_new__(uVar11);
        cimg::fread<unsigned_short>((unsigned_short *)puVar8,uVar16,(FILE *)__stream);
        if (0xff < uVar1) {
          cimg::invert_endianness<unsigned_short>((unsigned_short *)puVar8,uVar16);
        }
        puVar4 = this->_data;
        uVar1 = this->_width;
        uVar6 = this->_height;
        uVar2 = this->_depth;
        uVar3 = this->_spectrum;
        for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
            lVar10 = lVar10 + 1) {
          puVar4[lVar10] = (uchar)*(unsigned_short *)((long)puVar8 + lVar10 * 2);
          uVar15 = uVar15 - 2;
        }
      }
      else {
        uVar15 = uVar16 * 4;
        puVar8 = (uint *)operator_new__(-(ulong)(uVar16 >> 0x3e != 0) | uVar15);
        cimg::fread<unsigned_int>(puVar8,uVar16,(FILE *)__stream);
        if (0xff < uVar1) {
          cimg::invert_endianness<unsigned_int>(puVar8,uVar16);
        }
        puVar4 = this->_data;
        uVar1 = this->_width;
        uVar6 = this->_height;
        uVar2 = this->_depth;
        uVar3 = this->_spectrum;
        for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
            lVar10 = lVar10 + 1) {
          puVar4[lVar10] = (uchar)puVar8[lVar10];
          uVar15 = uVar15 - 4;
        }
      }
      goto LAB_001aa7e7;
    }
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  default:
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar12 = "non-";
    if (this->_is_shared != false) {
      pcVar12 = "";
    }
    pcVar13 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar13 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar9,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Unable to load data with ID_type %u in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar12,"unsigned char",(ulong)imageid,pcVar13);
    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
  case 0x10:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 0x11:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x12:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x13:
    cimg::fread<unsigned_int>(dims,5,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,5);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 0x14:
    cimg::fread<unsigned_int>(dims,5,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,5);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x15:
    cimg::fread<unsigned_int>(dims,5,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,5);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x16:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 0x17:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x18:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<unsigned_int>((uint *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>((uint *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x19:
    cimg::fread<unsigned_int>(dims,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,2);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x1a:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
    goto LAB_001aa311;
  case 0x1b:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x1c:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<unsigned_int>((uint *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>((uint *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x1d:
    cimg::fread<unsigned_int>(dims,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,3);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x1e:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    puVar7 = (uchar *)operator_new__(uVar16);
    cimg::fread<unsigned_char>(puVar7,uVar16,(FILE *)__stream);
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = puVar7[lVar10];
    }
LAB_001aa311:
    puVar7 = puVar7 + (lVar10 - uVar16);
LAB_001aa317:
    operator_delete__(puVar7);
    goto LAB_001aa4db;
  case 0x1f:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<int>((int *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>((int *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x20:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<unsigned_int>((uint *)ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>((uint *)ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = *(uchar *)(ptr + lVar10);
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x21:
    cimg::fread<unsigned_int>(dims,4,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<unsigned_int>(dims,4);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar15 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    uVar16 = uVar15 * 4;
    ptr = (float *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar16);
    cimg::fread<float>(ptr,uVar15,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<float>(ptr,uVar15);
    }
    puVar4 = this->_data;
    uVar1 = this->_width;
    uVar6 = this->_height;
    uVar2 = this->_depth;
    uVar3 = this->_spectrum;
    for (lVar10 = 0; (ulong)uVar3 * (ulong)uVar2 * (ulong)uVar6 * (ulong)uVar1 - lVar10 != 0;
        lVar10 = lVar10 + 1) {
      puVar4[lVar10] = (uchar)(int)ptr[lVar10];
      uVar16 = uVar16 - 4;
    }
    break;
  case 0x22:
    cimg::fread<int>(ptbuf,1,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>(ptbuf,1);
    }
    assign(this,1,1,1,1);
    *this->_data = (uchar)ptbuf[0];
    goto LAB_001aa4db;
  case 0x23:
    cimg::fread<int>(ptbuf,2,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>(ptbuf,2);
    }
    assign(this,2,1,1,1);
    *this->_data = (uchar)ptbuf[1];
    this->_data[1] = (uchar)ptbuf[0];
    goto LAB_001aa4db;
  case 0x24:
    cimg::fread<int>(ptbuf,3,(FILE *)__stream);
    if (0xff < uVar1) {
      cimg::invert_endianness<int>(ptbuf,3);
    }
    assign(this,3,1,1,1);
    *this->_data = (uchar)ptbuf[2];
    this->_data[1] = (uchar)ptbuf[1];
    this->_data[2] = (uchar)ptbuf[0];
    goto LAB_001aa4db;
  }
  pvVar14 = (void *)((long)ptr - uVar16);
LAB_001aa4d1:
  operator_delete__(pvVar14);
LAB_001aa4db:
  if (file == (FILE *)0x0) {
    cimg::fclose(__stream);
  }
  CImg<char>::~CImg(&header);
  return this;
}

Assistant:

CImg<T>& _load_pandore(std::FILE *const file, const char *const filename) {
#define __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,ndim,stype) \
        cimg::fread(dims,nbdim,nfile); \
        if (endian) cimg::invert_endianness(dims,nbdim); \
        assign(nwidth,nheight,ndepth,ndim); \
        const size_t siz = size(); \
        stype *buffer = new stype[siz]; \
        cimg::fread(buffer,siz,nfile); \
        if (endian) cimg::invert_endianness(buffer,siz); \
        T *ptrd = _data; \
        cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++); \
        buffer-=siz; \
        delete[] buffer

#define _cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1,stype2,stype3,ltype) { \
        if (sizeof(stype1)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1); } \
        else if (sizeof(stype2)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype2); } \
        else if (sizeof(stype3)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype3); } \
        else throw CImgIOException(_cimg_instance \
                                   "load_pandore(): Unknown pixel datatype in file '%s'.", \
                                   cimg_instance, \
                                   filename?filename:"(FILE*)"); }
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pandore(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> header(32);
      cimg::fread(header._data,12,nfile);
      if (cimg::strncasecmp("PANDORE",header,7)) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): PANDORE header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      unsigned int imageid, dims[8] = { 0 };
      int ptbuf[4] = { 0 };
      cimg::fread(&imageid,1,nfile);
      const bool endian = imageid>255;
      if (endian) cimg::invert_endianness(imageid);
      cimg::fread(header._data,20,nfile);

      switch (imageid) {
      case 2 : _cimg_load_pandore_case(2,dims[1],1,1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 3 : _cimg_load_pandore_case(2,dims[1],1,1,1,long,int,short,4); break;
      case 4 : _cimg_load_pandore_case(2,dims[1],1,1,1,double,float,float,4); break;
      case 5 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 6 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,long,int,short,4); break;
      case 7 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,double,float,float,4); break;
      case 8 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,unsigned char,unsigned char,unsigned char,1); break;
      case 9 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,long,int,short,4); break;
      case 10 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,double,float,float,4); break;
      case 11 : { // Region 1D
        cimg::fread(dims,3,nfile);
        if (endian) cimg::invert_endianness(dims,3);
        assign(dims[1],1,1,1);
        const unsigned siz = size();
        if (dims[2]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[2]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 12 : { // Region 2D
        cimg::fread(dims,4,nfile);
        if (endian) cimg::invert_endianness(dims,4);
        assign(dims[2],dims[1],1,1);
        const size_t siz = size();
        if (dims[3]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[3]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 13 : { // Region 3D
        cimg::fread(dims,5,nfile);
        if (endian) cimg::invert_endianness(dims,5);
        assign(dims[3],dims[2],dims[1],1);
        const size_t siz = size();
        if (dims[4]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[4]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 16 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,unsigned char,unsigned char,unsigned char,1); break;
      case 17 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,long,int,short,4); break;
      case 18 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,double,float,float,4); break;
      case 19 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,unsigned char,unsigned char,unsigned char,1); break;
      case 20 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,long,int,short,4); break;
      case 21 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,double,float,float,4); break;
      case 22 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 23 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],long,int,short,4); break;
      case 24 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 25 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],double,float,float,4); break;
      case 26 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 27 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],long,int,short,4); break;
      case 28 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 29 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],double,float,float,4); break;
      case 30 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned char,unsigned char,unsigned char,1);
        break;
      case 31 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],long,int,short,4); break;
      case 32 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned long,unsigned int,unsigned short,4);
        break;
      case 33 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],double,float,float,4); break;
      case 34 : { // Points 1D
        cimg::fread(ptbuf,1,nfile);
        if (endian) cimg::invert_endianness(ptbuf,1);
        assign(1); (*this)(0) = (T)ptbuf[0];
      } break;
      case 35 : { // Points 2D
        cimg::fread(ptbuf,2,nfile);
        if (endian) cimg::invert_endianness(ptbuf,2);
        assign(2); (*this)(0) = (T)ptbuf[1]; (*this)(1) = (T)ptbuf[0];
      } break;
      case 36 : { // Points 3D
        cimg::fread(ptbuf,3,nfile);
        if (endian) cimg::invert_endianness(ptbuf,3);
        assign(3); (*this)(0) = (T)ptbuf[2]; (*this)(1) = (T)ptbuf[1]; (*this)(2) = (T)ptbuf[0];
      } break;
      default :
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): Unable to load data with ID_type %u in file '%s'.",
                              cimg_instance,
                              imageid,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }